

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O1

void activate(layer_t *layer,tensor_t<float> *in)

{
  int iVar1;
  
  switch(layer->type) {
  case conv:
    std::vector<float,_std::allocator<float>_>::operator=(&(layer->in).data,&in->data);
    iVar1 = (in->size).y;
    (layer->in).size.x = (in->size).x;
    (layer->in).size.y = iVar1;
    (layer->in).size.z = (in->size).z;
    conv_layer_t::activate((conv_layer_t *)layer);
    return;
  case fc:
    std::vector<float,_std::allocator<float>_>::operator=(&(layer->in).data,&in->data);
    iVar1 = (in->size).y;
    (layer->in).size.x = (in->size).x;
    (layer->in).size.y = iVar1;
    (layer->in).size.z = (in->size).z;
    fc_layer_t::activate((fc_layer_t *)layer);
    return;
  case relu:
    std::vector<float,_std::allocator<float>_>::operator=(&(layer->in).data,&in->data);
    iVar1 = (in->size).y;
    (layer->in).size.x = (in->size).x;
    (layer->in).size.y = iVar1;
    (layer->in).size.z = (in->size).z;
    relu_layer_t::activate((relu_layer_t *)layer);
    return;
  case pool:
    std::vector<float,_std::allocator<float>_>::operator=(&(layer->in).data,&in->data);
    iVar1 = (in->size).y;
    (layer->in).size.x = (in->size).x;
    (layer->in).size.y = iVar1;
    (layer->in).size.z = (in->size).z;
    pool_layer_t::activate((pool_layer_t *)layer);
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/cnn.h"
                  ,0x41,"void activate(layer_t *, tensor_t<float> &)");
  }
}

Assistant:

static void activate(layer_t *layer, tensor_t<float> &in) {
    switch (layer->type) {
        case layer_type::conv:
            ((conv_layer_t *) layer)->activate(in);
            return;
        case layer_type::relu:
            ((relu_layer_t *) layer)->activate(in);
            return;
        case layer_type::fc:
            ((fc_layer_t *) layer)->activate(in);
            return;
        case layer_type::pool:
            ((pool_layer_t *) layer)->activate(in);
            return;
        default:
            assert(false);
    }
}